

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O2

void __thiscall ElideMiddleNothingToElide::Run(ElideMiddleNothingToElide *this)

{
  Test *pTVar1;
  __type _Var2;
  bool bVar3;
  string sStack_58;
  string input;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"Nothing to elide in this short string.",(allocator<char> *)&sStack_58
            );
  pTVar1 = g_current_test;
  ElideMiddle(&sStack_58,&input,0x50);
  _Var2 = std::operator==(&input,&sStack_58);
  testing::Test::Check
            (pTVar1,_Var2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x19d,"input == ElideMiddle(input, 80)");
  std::__cxx11::string::~string((string *)&sStack_58);
  pTVar1 = g_current_test;
  ElideMiddle(&sStack_58,&input,0x26);
  _Var2 = std::operator==(&input,&sStack_58);
  testing::Test::Check
            (pTVar1,_Var2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x19e,"input == ElideMiddle(input, 38)");
  std::__cxx11::string::~string((string *)&sStack_58);
  pTVar1 = g_current_test;
  ElideMiddle(&sStack_58,&input,0);
  bVar3 = std::operator==("",&sStack_58);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x19f,"\"\" == ElideMiddle(input, 0)");
  std::__cxx11::string::~string((string *)&sStack_58);
  pTVar1 = g_current_test;
  ElideMiddle(&sStack_58,&input,1);
  bVar3 = std::operator==(".",&sStack_58);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x1a0,"\".\" == ElideMiddle(input, 1)");
  std::__cxx11::string::~string((string *)&sStack_58);
  pTVar1 = g_current_test;
  ElideMiddle(&sStack_58,&input,2);
  bVar3 = std::operator==("..",&sStack_58);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x1a1,"\"..\" == ElideMiddle(input, 2)");
  std::__cxx11::string::~string((string *)&sStack_58);
  pTVar1 = g_current_test;
  ElideMiddle(&sStack_58,&input,3);
  bVar3 = std::operator==("...",&sStack_58);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x1a2,"\"...\" == ElideMiddle(input, 3)");
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

TEST(ElideMiddle, NothingToElide) {
  string input = "Nothing to elide in this short string.";
  EXPECT_EQ(input, ElideMiddle(input, 80));
  EXPECT_EQ(input, ElideMiddle(input, 38));
  EXPECT_EQ("", ElideMiddle(input, 0));
  EXPECT_EQ(".", ElideMiddle(input, 1));
  EXPECT_EQ("..", ElideMiddle(input, 2));
  EXPECT_EQ("...", ElideMiddle(input, 3));
}